

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

int float128_compare_quiet_mips(float128 a,float128 b,float_status *status)

{
  int iVar1;
  
  iVar1 = float128_compare_internal(a,b,1,status);
  return iVar1;
}

Assistant:

int float128_compare_quiet(float128 a, float128 b, float_status *status)
{
    return float128_compare_internal(a, b, 1, status);
}